

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::scalarTag(Input *this,string *Tag)

{
  string local_38;
  
  Node::getVerbatimTag_abi_cxx11_(&local_38,this->CurrentNode->_node);
  std::__cxx11::string::operator=((string *)Tag,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Input::scalarTag(std::string &Tag) {
  Tag = CurrentNode->_node->getVerbatimTag();
}